

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lapi.c
# Opt level: O3

int lua_getmetatable(lua_State *L,int objindex)

{
  Table *pTVar1;
  StkId pSVar2;
  TValue *pTVar3;
  Table **ppTVar4;
  uint uVar5;
  
  pTVar3 = index2value(L,objindex);
  uVar5 = pTVar3->tt_ & 0xf;
  if ((ulong)uVar5 == 7) {
    ppTVar4 = (Table **)((pTVar3->value_).f + 0x18);
  }
  else if (uVar5 == 5) {
    ppTVar4 = (Table **)((pTVar3->value_).f + 0x20);
  }
  else {
    ppTVar4 = L->l_G->mt + uVar5;
  }
  pTVar1 = *ppTVar4;
  if (pTVar1 != (Table *)0x0) {
    pSVar2 = (L->top).p;
    (pSVar2->val).value_.gc = (GCObject *)pTVar1;
    (pSVar2->val).tt_ = 'E';
    (L->top).p = (StkId)((L->top).offset + 0x10);
  }
  return (uint)(pTVar1 != (Table *)0x0);
}

Assistant:

LUA_API int lua_getmetatable (lua_State *L, int objindex) {
  const TValue *obj;
  Table *mt;
  int res = 0;
  lua_lock(L);
  obj = index2value(L, objindex);
  switch (ttype(obj)) {
    case LUA_TTABLE:
      mt = hvalue(obj)->metatable;
      break;
    case LUA_TUSERDATA:
      mt = uvalue(obj)->metatable;
      break;
    default:
      mt = G(L)->mt[ttype(obj)];
      break;
  }
  if (mt != NULL) {
    sethvalue2s(L, L->top.p, mt);
    api_incr_top(L);
    res = 1;
  }
  lua_unlock(L);
  return res;
}